

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::WBSetBit(LargeHeapBlock *this,char *addr)

{
  int iVar1;
  AutoNestedHandledExceptionType local_1c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  iVar1 = *(int *)&(this->super_HeapBlock).address;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_1c,ExceptionType_DisableCheck);
  CCLock::Enter(&wbVerifyBitsLock.super_CCLock);
  BVSparse<Memory::HeapAllocator>::Set(&this->wbVerifyBits,(uint)((int)addr - iVar1) >> 3);
  CCLock::Leave(&wbVerifyBitsLock.super_CCLock);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_1c);
  return;
}

Assistant:

void LargeHeapBlock::WBSetBit(char* addr)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    try
    {
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(static_cast<ExceptionType>(ExceptionType_DisableCheck));
        AutoCriticalSection autoCs(&wbVerifyBitsLock);
        wbVerifyBits.Set(index);
    }
    catch (Js::OutOfMemoryException&)
    {
    }
}